

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SchemaAttDef::SchemaAttDef(SchemaAttDef *this,SchemaAttDef *other)

{
  AttTypes type;
  DefAttTypes defType;
  uint uriId;
  XMLCh *pXVar1;
  XMLCh *pXVar2;
  MemoryManager *pMVar3;
  QName *this_00;
  QName *this_01;
  XMLSize_t XVar4;
  ValueVectorOf<unsigned_int> *this_02;
  QName *otherName;
  SchemaAttDef *other_local;
  SchemaAttDef *this_local;
  
  pXVar1 = XMLAttDef::getValue(&other->super_XMLAttDef);
  type = XMLAttDef::getType(&other->super_XMLAttDef);
  defType = XMLAttDef::getDefaultType(&other->super_XMLAttDef);
  pXVar2 = XMLAttDef::getEnumeration(&other->super_XMLAttDef);
  pMVar3 = XMLAttDef::getMemoryManager(&other->super_XMLAttDef);
  XMLAttDef::XMLAttDef(&this->super_XMLAttDef,pXVar1,type,defType,pXVar2,pMVar3);
  (this->super_XMLAttDef).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaAttDef_005369c8;
  this->fElemId = 0xfffffffe;
  this->fPSVIScope = other->fPSVIScope;
  this->fAttName = (QName *)0x0;
  this->fDatatypeValidator = other->fDatatypeValidator;
  this->fNamespaceList = (ValueVectorOf<unsigned_int> *)0x0;
  this->fBaseAttDecl = other->fBaseAttDecl;
  this_00 = getAttName(other);
  pMVar3 = XMLAttDef::getMemoryManager(&this->super_XMLAttDef);
  this_01 = (QName *)XMemory::operator_new(0x48,pMVar3);
  pXVar1 = QName::getPrefix(this_00);
  pXVar2 = QName::getLocalPart(this_00);
  uriId = QName::getURI(this_00);
  pMVar3 = XMLAttDef::getMemoryManager(&this->super_XMLAttDef);
  QName::QName(this_01,pXVar1,pXVar2,uriId,pMVar3);
  this->fAttName = this_01;
  if (other->fNamespaceList != (ValueVectorOf<unsigned_int> *)0x0) {
    XVar4 = ValueVectorOf<unsigned_int>::size(other->fNamespaceList);
    if (XVar4 != 0) {
      pMVar3 = XMLAttDef::getMemoryManager(&this->super_XMLAttDef);
      this_02 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,pMVar3);
      ValueVectorOf<unsigned_int>::ValueVectorOf(this_02,other->fNamespaceList);
      this->fNamespaceList = this_02;
    }
  }
  return;
}

Assistant:

SchemaAttDef::SchemaAttDef(const SchemaAttDef* other) :

    XMLAttDef(other->getValue(), other->getType(),
              other->getDefaultType(), other->getEnumeration(),
              other->getMemoryManager())
    , fElemId(XMLElementDecl::fgInvalidElemId)
    , fPSVIScope(other->fPSVIScope)
    , fAttName(0)
    , fDatatypeValidator(other->fDatatypeValidator)
    , fNamespaceList(0)
    , fBaseAttDecl(other->fBaseAttDecl)
{
    QName* otherName = other->getAttName();
    fAttName = new (getMemoryManager()) QName(otherName->getPrefix(),
                         otherName->getLocalPart(), otherName->getURI(),
                         getMemoryManager());

    if (other->fNamespaceList && other->fNamespaceList->size()) {
        fNamespaceList = new (getMemoryManager()) ValueVectorOf<unsigned int>(*(other->fNamespaceList));
    }
}